

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

BIGNUM * bn_expand2(BIGNUM *a,int words)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong *puVar7;
  int iVar8;
  
  if (words <= a->dmax) {
    return a;
  }
  if ((words < 0x800000) && ((a->flags & 2U) == 0)) {
    if ((a->flags & 8U) == 0) {
      puVar5 = (ulong *)CRYPTO_zalloc((long)words << 3);
    }
    else {
      puVar5 = (ulong *)CRYPTO_secure_zalloc((long)words << 3);
    }
    if (puVar5 != (ulong *)0x0) {
      puVar6 = a->d;
      if (puVar6 != (ulong *)0x0) {
        uVar1 = a->top;
        iVar8 = (int)uVar1 >> 2;
        puVar7 = puVar5;
        if (0 < iVar8) {
          iVar8 = iVar8 + 1;
          do {
            uVar2 = puVar6[1];
            uVar3 = puVar6[2];
            uVar4 = puVar6[3];
            *puVar7 = *puVar6;
            puVar7[1] = uVar2;
            puVar7[2] = uVar3;
            puVar7[3] = uVar4;
            puVar7 = puVar7 + 4;
            puVar6 = puVar6 + 4;
            iVar8 = iVar8 + -1;
          } while (1 < iVar8);
        }
        switch(uVar1 & 3) {
        case 3:
          puVar7[2] = puVar6[2];
        case 2:
          puVar7[1] = puVar6[1];
        case 1:
          *puVar7 = *puVar6;
        }
      }
      goto switchD_00112403_caseD_0;
    }
  }
  puVar5 = (ulong *)0x0;
switchD_00112403_caseD_0:
  if (puVar5 != (ulong *)0x0) {
    if (a->d != (ulong *)0x0) {
      CRYPTO_memzero(a->d,(long)a->dmax << 3);
      bn_free_d((BIGNUM *)a);
    }
    a->d = puVar5;
    a->dmax = words;
    if (puVar5 != (ulong *)0x0) {
      return a;
    }
  }
  return (BIGNUM *)0x0;
}

Assistant:

BIGNUM *bn_expand2(BIGNUM *b, int words)
{
    bn_check_top(b);

    if (words > b->dmax) {
        BN_ULONG *a = bn_expand_internal(b, words);
        if (!a)
            return NULL;
        if (b->d) {
            CRYPTO_memzero(b->d, b->dmax * sizeof(b->d[0]));
            bn_free_d(b);
        }
        b->d = a;
        b->dmax = words;
    }

    bn_check_top(b);
    return b;
}